

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  size_t *psVar1;
  TestCase *pTVar2;
  pointer pcVar3;
  IStreamingReporter *pIVar4;
  undefined1 local_3b0 [8];
  Totals deltaTotals;
  SectionStats testCaseSectionStats;
  Counts assertions;
  undefined1 local_2d8 [8];
  AssertionResult result;
  long *local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  long local_230 [2];
  int local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  size_t local_1f0;
  undefined1 local_1e8;
  undefined1 local_118 [8];
  AssertionResultData tempResult;
  SectionInfo testCaseSection;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0x10])();
  local_118 = (undefined1  [8])&tempResult.message._M_string_length;
  tempResult.message._M_dataplus._M_p = (pointer)0x0;
  tempResult.message._M_string_length._0_1_ = 0;
  tempResult.message.field_2._8_8_ = &tempResult.reconstructedExpression._M_string_length;
  tempResult.reconstructedExpression._M_dataplus._M_p = (pointer)0x0;
  tempResult.reconstructedExpression._M_string_length._0_1_ = 0;
  tempResult.reconstructedExpression.field_2._8_8_ = 0;
  tempResult.lazyExpression.m_transientExpression._0_1_ = 0;
  tempResult.lazyExpression.m_isNegated = true;
  tempResult.lazyExpression._9_3_ = 2;
  result.m_resultData._80_8_ = &local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&result.m_resultData.resultType,message.m_start,
             message.m_start + message.m_size);
  std::__cxx11::string::operator=((string *)local_118,(string *)&result.m_resultData.resultType);
  if ((undefined1 *)result.m_resultData._80_8_ != &local_238) {
    operator_delete((void *)result.m_resultData._80_8_,CONCAT71(uStack_237,local_238) + 1);
  }
  AssertionResult::AssertionResult
            ((AssertionResult *)local_2d8,&this->m_lastAssertionInfo,
             (AssertionResultData *)local_118);
  assertionEnded(this,(AssertionResult *)local_2d8);
  handleUnfinishedSections(this);
  pTVar2 = this->m_activeTestCase;
  tempResult._80_8_ = &testCaseSection.name._M_string_length;
  pcVar3 = (pTVar2->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tempResult.resultType,pcVar3,
             pcVar3 + (pTVar2->super_TestCaseInfo).name._M_string_length);
  testCaseSection.name.field_2._8_8_ = &testCaseSection.description._M_string_length;
  testCaseSection.description._M_dataplus._M_p = (pointer)0x0;
  testCaseSection.description._M_string_length._0_1_ = 0;
  testCaseSection.description.field_2._8_8_ = (pTVar2->super_TestCaseInfo).lineInfo.file;
  testCaseSection.lineInfo.file = (char *)(pTVar2->super_TestCaseInfo).lineInfo.line;
  testCaseSectionStats.missingAssertions = false;
  testCaseSectionStats._121_7_ = 0;
  SectionStats::SectionStats
            ((SectionStats *)&deltaTotals.testCases.failedButOk,
             (SectionInfo *)&tempResult.resultType,(Counts *)&testCaseSectionStats.missingAssertions
             ,0.0,false);
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar4->_vptr_IStreamingReporter[0xb])(pIVar4,&deltaTotals.testCases.failedButOk);
  local_3b0._0_4_ = 0;
  deltaTotals.testCases.failed = 0;
  deltaTotals.error = 0;
  deltaTotals._4_4_ = 0;
  deltaTotals.assertions.failed = 0;
  deltaTotals.assertions.failedButOk = 0;
  deltaTotals.testCases.passed = 1;
  deltaTotals.assertions.passed = 1;
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_60 = 0;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  testCaseSection.lineInfo.line = (size_t)&local_60;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)&result.m_resultData.resultType,
             &this->m_activeTestCase->super_TestCaseInfo,(Totals *)local_3b0,
             (string *)&testCaseSection.lineInfo.line,&local_50,false);
  (*pIVar4->_vptr_IStreamingReporter[0xc])(pIVar4,&result.m_resultData.resultType);
  TestCaseStats::~TestCaseStats((TestCaseStats *)&result.m_resultData.resultType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)testCaseSection.lineInfo.line != &local_60) {
    operator_delete((void *)testCaseSection.lineInfo.line,CONCAT71(uStack_5f,local_60) + 1);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_240 = (long *)0x0;
  local_238 = 0;
  result.m_resultData._80_8_ = &local_238;
  testGroupEnded(this,(string *)&result.m_resultData.resultType,&this->m_totals,1,1);
  if ((undefined1 *)result.m_resultData._80_8_ != &local_238) {
    operator_delete((void *)result.m_resultData._80_8_,CONCAT71(uStack_237,local_238) + 1);
  }
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  result.m_resultData._80_8_ = &PTR__TestRunStats_00236aa0;
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar3,pcVar3 + (this->m_runInfo).name._M_string_length);
  local_1f0 = (this->m_totals).testCases.failedButOk;
  local_220 = (this->m_totals).error;
  uStack_21c = *(undefined4 *)&(this->m_totals).field_0x4;
  uStack_218 = (undefined4)(this->m_totals).assertions.passed;
  uStack_214 = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  local_210 = (undefined4)(this->m_totals).assertions.failed;
  uStack_20c = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  uStack_208 = (undefined4)(this->m_totals).assertions.failedButOk;
  uStack_204 = *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_200 = (undefined4)(this->m_totals).testCases.passed;
  uStack_1fc = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  uStack_1f8 = (undefined4)(this->m_totals).testCases.failed;
  uStack_1f4 = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_1e8 = 0;
  (*pIVar4->_vptr_IStreamingReporter[0xe])(pIVar4);
  result.m_resultData._80_8_ = &PTR__TestRunStats_00236aa0;
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  SectionStats::~SectionStats((SectionStats *)&deltaTotals.testCases.failedButOk);
  if ((size_type *)testCaseSection.name.field_2._8_8_ !=
      &testCaseSection.description._M_string_length) {
    operator_delete((void *)testCaseSection.name.field_2._8_8_,
                    CONCAT71(testCaseSection.description._M_string_length._1_7_,
                             (undefined1)testCaseSection.description._M_string_length) + 1);
  }
  if ((size_type *)tempResult._80_8_ != &testCaseSection.name._M_string_length) {
    operator_delete((void *)tempResult._80_8_,testCaseSection.name._M_string_length + 1);
  }
  if ((size_type *)result.m_resultData.message.field_2._8_8_ !=
      &result.m_resultData.reconstructedExpression._M_string_length) {
    operator_delete((void *)result.m_resultData.message.field_2._8_8_,
                    result.m_resultData.reconstructedExpression._M_string_length + 1);
  }
  if ((size_type *)result.m_info._48_8_ != &result.m_resultData.message._M_string_length) {
    operator_delete((void *)result.m_info._48_8_,result.m_resultData.message._M_string_length + 1);
  }
  if ((size_type *)tempResult.message.field_2._8_8_ !=
      &tempResult.reconstructedExpression._M_string_length) {
    operator_delete((void *)tempResult.message.field_2._8_8_,
                    CONCAT71(tempResult.reconstructedExpression._M_string_length._1_7_,
                             (undefined1)tempResult.reconstructedExpression._M_string_length) + 1);
  }
  if (local_118 != (undefined1  [8])&tempResult.message._M_string_length) {
    operator_delete((void *)local_118,
                    CONCAT71(tempResult.message._M_string_length._1_7_,
                             (undefined1)tempResult.message._M_string_length) + 1);
  }
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition(StringRef message) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult(ResultWas::FatalErrorCondition, { false });
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
            deltaTotals,
            std::string(),
            std::string(),
            false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }